

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

double * r8mat_test(char trans,int lda,int m,int n)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar9 = 0;
  uVar8 = 0;
  if (0 < n) {
    uVar8 = (ulong)(uint)n;
  }
  if (trans == 'N') {
    uVar3 = 0xffffffffffffffff;
    if (-1 < n * lda) {
      uVar3 = (ulong)(uint)(n * lda) * 8;
    }
    pdVar1 = (double *)operator_new__(uVar3);
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar9;
    }
    iVar2 = 0xb;
    pdVar4 = pdVar1;
    while (uVar9 != uVar8) {
      uVar9 = uVar9 + 1;
      iVar5 = iVar2;
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        pdVar4[uVar6] = (double)iVar5;
        iVar5 = iVar5 + 10;
      }
      pdVar4 = pdVar4 + lda;
      iVar2 = iVar2 + 1;
    }
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < m * lda) {
      uVar3 = (ulong)(uint)(m * lda) * 8;
    }
    pdVar1 = (double *)operator_new__(uVar3);
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar9;
    }
    iVar2 = 0xb;
    pdVar4 = pdVar1;
    while (uVar9 != uVar8) {
      uVar9 = uVar9 + 1;
      pdVar7 = pdVar4;
      uVar6 = uVar3;
      iVar5 = iVar2;
      while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
        *pdVar7 = (double)iVar5;
        pdVar7 = pdVar7 + lda;
        iVar5 = iVar5 + 10;
      }
      pdVar4 = pdVar4 + 1;
      iVar2 = iVar2 + 1;
    }
  }
  return pdVar1;
}

Assistant:

double *r8mat_test ( char trans, int lda, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_TEST sets up a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//  
//  Modified:
//
//    10 February 2014
//
//  Author:
//
//    John Burkardt.
//
//  Parameters:
//
//    Input, char TRANS, indicates whether matrix is to be transposed.
//    'N', no transpose.
//    'T', transpose the matrix.
//
//    Input, int LDA, the leading dimension of the matrix.
//
//    Input, int M, N, the number of rows and columns of the matrix.
//
//    Output, double R8MAT_TEST[?], the matrix.
//    if TRANS is 'N', then the matrix is stored in LDA*N entries,
//    as an M x N matrix;
//    if TRANS is 'T', then the matrix is stored in LDA*M entries,
//    as an N x M matrix.
//
{
  double *a;
  int i;
  int j;

  if ( trans == 'N' )
  {
    a = new double[lda*n];

    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        a[i+j*lda] = static_cast<double> ( 10 * ( i + 1 ) + ( j + 1 ) );
      }
    }
  }
  else
  {
    a = new double[lda*m];

    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        a[j+i*lda] = static_cast<double> ( 10 * ( i + 1 ) + ( j + 1 ) );
      }
    }
  }
  return a;
}